

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSetImplement.h
# Opt level: O3

void * __thiscall
BitSetImplement<std::bitset<16000UL>,_KDefectiveSimple>::neighborSetOf
          (BitSetImplement<std::bitset<16000UL>,_KDefectiveSimple> *this,int idx)

{
  ulong *puVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  pointer piVar4;
  void *__s;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  __s = operator_new(2000);
  memset(__s,0,2000);
  pvVar3 = (this->super_KDefectiveSimple).super_KDefectiveBase.from;
  piVar4 = pvVar3[idx].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  lVar6 = (long)pvVar3[idx].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar4;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 2;
    lVar7 = 0;
    do {
      iVar2 = piVar4[lVar7];
      uVar5 = (ulong)iVar2;
      if (15999 < uVar5) {
        std::__throw_out_of_range_fmt
                  ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar5,16000);
      }
      puVar1 = (ulong *)((long)__s + (uVar5 >> 6) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
      lVar7 = lVar7 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
  }
  return __s;
}

Assistant:

void* BitSetImplement<Bitset, Base>::neighborSetOf(int idx) {
	Bitset *__Nei__ = new Bitset();
	for (int i = 0; i < from[idx].size(); i++) {
		int to = from[idx][i];
		__Nei__ -> set(to);
	}
	return __Nei__;
}